

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSaveNumericBoard.cpp
# Opt level: O2

void __thiscall
testSaveNumericBoard_NoSizeChange_Test::~testSaveNumericBoard_NoSizeChange_Test
          (testSaveNumericBoard_NoSizeChange_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(testSaveNumericBoard, NoSizeChange)
{
    auto board = createAndSaveBoard(BoardSize::SEVEN);
    auto initialValues = board->getBoardValues();

    board->generateBoard();
    auto changedValues = board->getBoardValues();
    ASSERT_NE(changedValues, initialValues);

    auto restoredBoard = restoreBoard(std::move(board));
    auto restoredValues = restoredBoard->getBoardValues();
    ASSERT_EQ(initialValues, restoredValues);
}